

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O2

void __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
basic_mustache(basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this)

{
  (this->error_message_)._M_dataplus._M_p = (pointer)&(this->error_message_).field_2;
  (this->error_message_)._M_string_length = 0;
  (this->error_message_).field_2._M_local_buf[0] = '\0';
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  component(&this->root_component_);
  *(undefined8 *)((long)&(this->escape_).super__Function_base._M_functor + 8) = 0;
  *(code **)&(this->escape_).super__Function_base._M_functor = html_escape<std::__cxx11::string>;
  (this->escape_)._M_invoker =
       Catch::clara::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  (this->escape_).super__Function_base._M_manager =
       Catch::clara::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  return;
}

Assistant:

basic_mustache()
        : escape_(html_escape<string_type>)
    {
    }